

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap_base.h
# Opt level: O0

void phmap::priv::map_slot_policy<std::__cxx11::string,unsigned_long>::
     transfer<std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
               (allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
                *alloc,slot_type *new_slot,slot_type *old_slot)

{
  slot_type *in_RDX;
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
  *in_RSI;
  
  map_slot_policy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  ::emplace((slot_type *)0x1bb4cc);
  allocator_traits<std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>::
  construct<std::pair<std::__cxx11::string,unsigned_long>,std::pair<std::__cxx11::string,unsigned_long>>
            (in_RSI,(pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
                     *)&in_RDX->value,
             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
              *)0x1bb4df);
  destroy<std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>(in_RSI,in_RDX);
  return;
}

Assistant:

static void transfer(Allocator* alloc, slot_type* new_slot,
			                     slot_type* old_slot)
			{
				emplace(new_slot);
				if (kMutableKeys::value) {
					phmap::allocator_traits<Allocator>::construct(
					    *alloc, &new_slot->mutable_value, std::move(old_slot->mutable_value));
				}
				else {
					phmap::allocator_traits<Allocator>::construct(*alloc, &new_slot->value,
					        std::move(old_slot->value));
				}
				destroy(alloc, old_slot);
			}